

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O0

void __thiscall adios2::transport::FilePOSIX::Close(FilePOSIX *this)

{
  int *piVar1;
  long in_RDI;
  int status;
  allocator *__rhs;
  string *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Transport *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  string *in_stack_fffffffffffffeb8;
  FilePOSIX *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  string local_120 [24];
  FilePOSIX *in_stack_fffffffffffffef8;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89 [40];
  allocator local_61;
  string local_60 [32];
  int local_40;
  allocator local_29;
  
  WaitForOpen(in_stack_fffffffffffffec0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd8,"close",&local_29);
  this_00 = (Transport *)&stack0xffffffffffffffd8;
  Transport::ProfilerStart(this_00,in_stack_fffffffffffffe78);
  std::__cxx11::string::~string((string *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  piVar1 = __errno_location();
  *piVar1 = 0;
  local_40 = close(*(int *)(in_RDI + 0xf0));
  piVar1 = __errno_location();
  *(int *)(in_RDI + 0xf4) = *piVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"close",&local_61);
  Transport::ProfilerStop(this_00,in_stack_fffffffffffffe78);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (local_40 == -1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_89 + 1),"Toolkit",(allocator *)__lhs);
    __rhs = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"transport::file::FilePOSIX",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Close",&local_d9);
    std::operator+((char *)in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    std::operator+(__lhs,(char *)__rhs);
    SysErrMsg_abi_cxx11_(in_stack_fffffffffffffef8);
    std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (string *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
  }
  *(undefined1 *)(in_RDI + 0x6c) = 0;
  return;
}

Assistant:

void FilePOSIX::Close()
{
    WaitForOpen();
    ProfilerStart("close");
    errno = 0;
    const int status = close(m_FileDescriptor);
    m_Errno = errno;
    ProfilerStop("close");

    if (status == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FilePOSIX", "Close",
                                              "couldn't close file " + m_Name + " " + SysErrMsg());
    }

    m_IsOpen = false;
}